

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmathlib.c
# Opt level: O3

int luaopen_math(lua_State *L)

{
  unsigned_long *state;
  lua_Unsigned n1;
  
  luaL_checkversion_(L,504.0,0x88);
  lua_createtable(L,0,0x1b);
  luaL_setfuncs(L,mathlib,0);
  lua_pushnumber(L,3.141592653589793);
  lua_setfield(L,-2,"pi");
  lua_pushnumber(L,INFINITY);
  lua_setfield(L,-2,"huge");
  lua_pushinteger(L,0x7fffffffffffffff);
  lua_setfield(L,-2,"maxinteger");
  lua_pushinteger(L,-0x8000000000000000);
  lua_setfield(L,-2,"mininteger");
  state = (unsigned_long *)lua_newuserdatauv(L,0x20,0);
  n1 = time((time_t *)0x0);
  setseed(L,state,n1,(lua_Unsigned)L);
  lua_settop(L,-3);
  luaL_setfuncs(L,randfuncs,1);
  return 1;
}

Assistant:

LUAMOD_API int luaopen_math (lua_State *L) {
  luaL_newlib(L, mathlib);
  lua_pushnumber(L, PI);
  lua_setfield(L, -2, "pi");
  lua_pushnumber(L, (lua_Number)HUGE_VAL);
  lua_setfield(L, -2, "huge");
  lua_pushinteger(L, LUA_MAXINTEGER);
  lua_setfield(L, -2, "maxinteger");
  lua_pushinteger(L, LUA_MININTEGER);
  lua_setfield(L, -2, "mininteger");
  setrandfunc(L);
  return 1;
}